

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

double nonius::detail::
       weighted_average_quantile<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (int k,int q,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar3 = (long)last._M_current - (long)first._M_current >> 3;
  dVar8 = (double)(long)((long)k * (uVar3 - 1)) / (double)q;
  pdVar5 = first._M_current + (int)dVar8;
  if ((last._M_current != first._M_current) && (pdVar5 != last._M_current)) {
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (first._M_current,pdVar5,last._M_current,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
  }
  dVar6 = *pdVar5;
  if (dVar8 - (double)(int)dVar8 != 0.0) {
    pdVar4 = pdVar5 + 1;
    pdVar5 = pdVar5 + 2;
    if (pdVar5 != last._M_current && pdVar4 != last._M_current) {
      dVar7 = *pdVar4;
      do {
        dVar1 = *pdVar5;
        if (dVar1 < dVar7) {
          pdVar4 = pdVar5;
        }
        if (dVar1 <= dVar7) {
          dVar7 = dVar1;
        }
        pdVar5 = pdVar5 + 1;
      } while (pdVar5 != last._M_current);
    }
    dVar6 = dVar6 + (*pdVar4 - dVar6) * (dVar8 - (double)(int)dVar8);
  }
  return dVar6;
}

Assistant:

double weighted_average_quantile(int k, int q, Iterator first, Iterator last) {
            auto count = last - first;
            double idx = (count - 1) * k /static_cast<double>(q);
            int j = static_cast<int>(idx);
            double g = idx - j;
            std::nth_element(first, first+j, last);
            auto xj = first[j];
            if(g == 0) return xj;

            auto xj1 = *std::min_element(first+(j+1), last);
            return xj + g * (xj1 - xj);
        }